

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacBac.c
# Opt level: O0

Bac_Man_t * Bac_ManReadBacInt(Vec_Str_t *vOut)

{
  int iVar1;
  int iVar2;
  Bac_Man_t *p_00;
  Bac_Ntk_t *pBVar3;
  int local_438;
  int local_434;
  int Num4;
  int Num3;
  int Num2;
  int Num1;
  int nNtks;
  int Pos;
  int NameId;
  int i;
  char Buffer [1000];
  Bac_Ntk_t *pNtk;
  Bac_Man_t *p;
  Vec_Str_t *vOut_local;
  
  memset(&NameId,0,1000);
  NameId._0_1_ = '#';
  Num1 = 0;
  while ((char)NameId == '#') {
    iVar1 = BacManReadBacLine(vOut,&Num1,(char *)&NameId,Buffer + 0x3e0);
    if (iVar1 == 0) {
      return (Bac_Man_t *)0x0;
    }
  }
  iVar1 = BacManReadBacNameAndNums((char *)&NameId,&Num2,&Num4,&local_434,&local_438);
  if (iVar1 == 0) {
    return (Bac_Man_t *)0x0;
  }
  if (0 < Num2) {
    p_00 = Bac_ManAlloc((char *)&NameId,Num2);
    Pos = 1;
    while( true ) {
      iVar1 = Pos;
      iVar2 = Bac_ManNtkNum(p_00);
      if (iVar2 < iVar1) {
        for (Pos = 1; iVar1 = Pos, iVar2 = Bac_ManNtkNum(p_00), iVar1 <= iVar2; Pos = Pos + 1) {
          pBVar3 = Bac_ManNtk(p_00,Pos);
          Bac_ManReadBacNtk(vOut,&Num1,pBVar3);
        }
        iVar2 = Bac_ManNtkNum(p_00);
        iVar1 = Num1;
        if (iVar2 == Num2) {
          iVar2 = Vec_StrSize(vOut);
          if (iVar1 == iVar2) {
            return p_00;
          }
          __assert_fail("Pos == Vec_StrSize(vOut)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/bac/bacBac.c"
                        ,0xb2,"Bac_Man_t *Bac_ManReadBacInt(Vec_Str_t *)");
        }
        __assert_fail("Bac_ManNtkNum(p) == nNtks",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/bac/bacBac.c"
                      ,0xb1,"Bac_Man_t *Bac_ManReadBacInt(Vec_Str_t *)");
      }
      pBVar3 = Bac_ManNtk(p_00,Pos);
      iVar1 = BacManReadBacLine(vOut,&Num1,(char *)&NameId,Buffer + 0x3e0);
      if (iVar1 == 0) {
        Bac_ManFree(p_00);
        return (Bac_Man_t *)0x0;
      }
      iVar1 = BacManReadBacNameAndNums((char *)&NameId,&Num3,&Num4,&local_434,&local_438);
      if (iVar1 == 0) break;
      if (((Num3 < 0) || (Num4 < 0)) || (local_434 < 0)) {
        __assert_fail("Num1 >= 0 && Num2 >= 0 && Num3 >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/bac/bacBac.c"
                      ,0xa9,"Bac_Man_t *Bac_ManReadBacInt(Vec_Str_t *)");
      }
      nNtks = Abc_NamStrFindOrAdd(p_00->pStrs,(char *)&NameId,(int *)0x0);
      Bac_NtkAlloc(pBVar3,nNtks,Num3,Num4,local_434);
      Vec_IntFill(&pBVar3->vInfo,local_438 * 3,-1);
      Pos = Pos + 1;
    }
    Bac_ManFree(p_00);
    return (Bac_Man_t *)0x0;
  }
  __assert_fail("nNtks > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/bac/bacBac.c"
                ,0x9a,"Bac_Man_t *Bac_ManReadBacInt(Vec_Str_t *)");
}

Assistant:

Bac_Man_t * Bac_ManReadBacInt( Vec_Str_t * vOut )
{
    Bac_Man_t * p;
    Bac_Ntk_t * pNtk;
    char Buffer[1000] = "#"; 
    int i, NameId, Pos = 0, nNtks, Num1, Num2, Num3, Num4;
    while ( Buffer[0] == '#' )
        if ( !BacManReadBacLine(vOut, &Pos, Buffer, Buffer+1000) )
            return NULL;
    if ( !BacManReadBacNameAndNums(Buffer, &nNtks, &Num2, &Num3, &Num4) )
        return NULL;
    // start manager
    assert( nNtks > 0 );
    p = Bac_ManAlloc( Buffer, nNtks );
    // start networks
    Bac_ManForEachNtk( p, pNtk, i )
    {
        if ( !BacManReadBacLine(vOut, &Pos, Buffer, Buffer+1000) )
        {
            Bac_ManFree( p );
            return NULL;
        }
        if ( !BacManReadBacNameAndNums(Buffer, &Num1, &Num2, &Num3, &Num4) )
        {
            Bac_ManFree( p );
            return NULL;
        }
        assert( Num1 >= 0 && Num2 >= 0 && Num3 >= 0 );
        NameId = Abc_NamStrFindOrAdd( p->pStrs, Buffer, NULL );
        Bac_NtkAlloc( pNtk, NameId, Num1, Num2, Num3 );
        Vec_IntFill( &pNtk->vInfo, 3 * Num4, -1 );
    }
    // read networks
    Bac_ManForEachNtk( p, pNtk, i )
        Bac_ManReadBacNtk( vOut, &Pos, pNtk );
    assert( Bac_ManNtkNum(p) == nNtks );
    assert( Pos == Vec_StrSize(vOut) );
    return p;
}